

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wchar.cpp
# Opt level: O0

size_t PAL_wcscspn(char16_t *string,char16_t *strCharSet)

{
  size_t local_30;
  size_t count;
  char16_t *temp;
  char16_t *strCharSet_local;
  char16_t *string_local;
  
  local_30 = 0;
  strCharSet_local = string;
  do {
    count = (size_t)strCharSet;
    if (*strCharSet_local == L'\0') {
      return local_30;
    }
    for (; *(short *)count != 0; count = count + 2) {
      if (*strCharSet_local == *(char16_t *)count) {
        return local_30;
      }
    }
    local_30 = local_30 + 1;
    strCharSet_local = strCharSet_local + 1;
  } while( true );
}

Assistant:

size_t
__cdecl
PAL_wcscspn(const char16_t *string, const char16_t *strCharSet)
{
    const char16_t *temp;
    size_t count = 0;

    PERF_ENTRY(wcscspn);

    while(*string != 0)
    {
        for(temp = strCharSet; *temp != 0; temp++)
        {
            if (*string == *temp)
            {
                PERF_EXIT(wcscspn);
                return count;
            }
        }
        count++;
        string++;
    }
    PERF_EXIT(wcscspn);
    return count;
}